

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O3

void printanymem(MCInst *MI,uint OpNo,SStream *O)

{
  uint uVar1;
  undefined4 in_register_00000034;
  
  uVar1 = MI->Opcode - 0x4d7;
  if (uVar1 < 4) {
    MI->x86opsize = (uint8_t)(0x8040402 >> ((char)uVar1 * '\b' & 0x1fU));
  }
  printMemReference(MI,1,(SStream *)CONCAT44(in_register_00000034,OpNo));
  return;
}

Assistant:

static void printanymem(MCInst *MI, unsigned OpNo, SStream *O)
{
	switch(MI->Opcode) {
		default: break;
		case X86_LEA16r:
				 MI->x86opsize = 2;
				 break;
		case X86_LEA32r:
		case X86_LEA64_32r:
				 MI->x86opsize = 4;
				 break;
		case X86_LEA64r:
				 MI->x86opsize = 8;
				 break;
	}
	printMemReference(MI, OpNo, O);
}